

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int experimental_arenas_create_ext_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  arena_config_t config;
  uint local_3c;
  arena_config_t local_38;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  local_38.extent_hooks = &duckdb_je_ehooks_default_extent_hooks;
  local_38.metadata_use_hooks = true;
  local_38._9_7_ = 0;
  if ((oldlenp == (size_t *)0x0 || oldp == (void *)0x0) || (*oldlenp != 4)) {
    iVar2 = 0x16;
    if (oldlenp != (size_t *)0x0) {
      *oldlenp = 0;
    }
  }
  else {
    if (newp != (void *)0x0) {
      iVar2 = 0x16;
      if (newlen != 0x10) goto LAB_01c7be46;
      local_38.extent_hooks = *newp;
      local_38._8_8_ = *(undefined8 *)((long)newp + 8);
    }
    local_3c = ctl_arena_init(tsd,&local_38);
    if (local_3c == 0xffffffff) {
      iVar2 = 0xb;
    }
    else {
      uVar1 = *oldlenp;
      if (uVar1 == 4) {
        *(uint *)oldp = local_3c;
        iVar2 = 0;
      }
      else {
        __n = 4;
        if (uVar1 < 4) {
          __n = uVar1;
        }
        switchD_015ff80e::default(oldp,&local_3c,__n);
        *oldlenp = __n;
        iVar2 = 0x16;
      }
    }
  }
LAB_01c7be46:
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
experimental_arenas_create_ext_ctl(tsd_t *tsd,
    const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);

	arena_config_t config = arena_config_default;
	VERIFY_READ(unsigned);
	WRITE(config, arena_config_t);

	if ((arena_ind = ctl_arena_init(tsd, &config)) == UINT_MAX) {
		ret = EAGAIN;
		goto label_return;
	}
	READ(arena_ind, unsigned);
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}